

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall cmLocalUnixMakefileGenerator3::Generate(cmLocalUnixMakefileGenerator3 *this)

{
  cmMakefile *pcVar1;
  cmGlobalUnixMakefileGenerator3 *this_00;
  pointer ppcVar2;
  cmGeneratorTarget *this_01;
  bool bVar3;
  TargetType TVar4;
  cmMakefileTargetGenerator *tg;
  pointer ppcVar5;
  allocator<char> local_49;
  string local_48;
  
  bVar3 = cmake::GetIsInTryCompile
                    (((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
                     CMakeInstance);
  if (!bVar3) {
    pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"CMAKE_COLOR_MAKEFILE",&local_49);
    bVar3 = cmMakefile::IsOn(pcVar1,&local_48);
    this->ColorMakefile = bVar3;
    std::__cxx11::string::~string((string *)&local_48);
  }
  pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"CMAKE_SKIP_PREPROCESSED_SOURCE_RULES",&local_49);
  bVar3 = cmMakefile::IsOn(pcVar1,&local_48);
  this->SkipPreprocessedSourceRules = bVar3;
  std::__cxx11::string::~string((string *)&local_48);
  pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"CMAKE_SKIP_ASSEMBLY_SOURCE_RULES",&local_49);
  bVar3 = cmMakefile::IsOn(pcVar1,&local_48);
  this->SkipAssemblySourceRules = bVar3;
  std::__cxx11::string::~string((string *)&local_48);
  this_00 = (cmGlobalUnixMakefileGenerator3 *)
            (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
  ppcVar2 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets.
            super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppcVar5 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets.
                 super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppcVar5 != ppcVar2; ppcVar5 = ppcVar5 + 1
      ) {
    this_01 = *ppcVar5;
    TVar4 = cmGeneratorTarget::GetType(this_01);
    if (TVar4 != INTERFACE_LIBRARY) {
      tg = cmMakefileTargetGenerator::New(this_01);
      if (tg != (cmMakefileTargetGenerator *)0x0) {
        (*(tg->super_cmCommonTargetGenerator)._vptr_cmCommonTargetGenerator[3])(tg);
        cmGlobalUnixMakefileGenerator3::RecordTargetProgress(this_00,tg);
        (*(tg->super_cmCommonTargetGenerator)._vptr_cmCommonTargetGenerator[1])(tg);
      }
    }
  }
  WriteLocalMakefile(this);
  WriteDirectoryInformationFile(this);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::Generate()
{
  // Record whether some options are enabled to avoid checking many
  // times later.
  if (!this->GetGlobalGenerator()->GetCMakeInstance()->GetIsInTryCompile()) {
    this->ColorMakefile = this->Makefile->IsOn("CMAKE_COLOR_MAKEFILE");
  }
  this->SkipPreprocessedSourceRules =
    this->Makefile->IsOn("CMAKE_SKIP_PREPROCESSED_SOURCE_RULES");
  this->SkipAssemblySourceRules =
    this->Makefile->IsOn("CMAKE_SKIP_ASSEMBLY_SOURCE_RULES");

  // Generate the rule files for each target.
  cmGlobalUnixMakefileGenerator3* gg =
    static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);
  for (cmGeneratorTarget* target : this->GetGeneratorTargets()) {
    if (target->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }
    std::unique_ptr<cmMakefileTargetGenerator> tg(
      cmMakefileTargetGenerator::New(target));
    if (tg) {
      tg->WriteRuleFiles();
      gg->RecordTargetProgress(tg.get());
    }
  }

  // write the local Makefile
  this->WriteLocalMakefile();

  // Write the cmake file with information for this directory.
  this->WriteDirectoryInformationFile();
}